

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSC.cpp
# Opt level: O3

void __thiscall CSC::CSC(CSC *this,int r,int c,int nnz,int *p,int *d,double *v)

{
  int *__s;
  int *__s_00;
  double *__s_01;
  ulong __n;
  size_t __n_00;
  ulong __n_01;
  size_t __n_02;
  
  this->row = r;
  this->col = c;
  this->nonzero = nnz;
  __n_00 = (ulong)(c + 1) << 2;
  __n_02 = __n_00;
  if (c < -1) {
    __n_02 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(__n_02);
  memset(__s,0,__n_02);
  this->ptr = __s;
  __n = (long)nnz * 4;
  if (nnz < 0) {
    __n = 0xffffffffffffffff;
  }
  __n_01 = (long)nnz * 8;
  if (nnz < 0) {
    __n_01 = 0xffffffffffffffff;
  }
  __s_00 = (int *)operator_new__(__n);
  memset(__s_00,0,__n);
  this->idx = __s_00;
  __s_01 = (double *)operator_new__(__n_01);
  memset(__s_01,0,__n_01);
  this->val = __s_01;
  if (-1 < c) {
    memcpy(__s,p,__n_00);
  }
  if (0 < nnz) {
    memcpy(__s_00,d,(ulong)(uint)nnz * 4);
    memcpy(__s_01,v,(ulong)(uint)nnz << 3);
    return;
  }
  return;
}

Assistant:

CSC::CSC(int r, int c, int nnz, int *p, int *d, double *v)
{
    row = r;
    col = c;
    nonzero = nnz;
    ptr = new int[col+1]();
    idx = new int[nonzero]();
    val = new double [nonzero]();

    for (int i = 0; i < col+1; ++i)
    {
      ptr[i] = p[i];
    }
    for (int i = 0; i < nonzero; ++i)
    {
        idx[i] = d[i];
    }
    for (int i = 0; i < nonzero; ++i)
    {
        val[i] = v[i];
    }

 }